

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnExceptionType
          (BinaryReaderIR *this,Index index,TypeVector *sig)

{
  Location local_58;
  ExceptionModuleField *local_38;
  _Head_base<0UL,_wabt::ExceptionModuleField_*,_false> local_30;
  
  GetLocation(&local_58,this);
  MakeUnique<wabt::ExceptionModuleField,wabt::Location>((wabt *)&local_38,&local_58);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&(local_38->except).sig,sig);
  local_30._M_head_impl = local_38;
  local_38 = (ExceptionModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                       *)&local_30);
  if (local_30._M_head_impl != (ExceptionModuleField *)0x0) {
    (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField
      ._vptr_ModuleField[1])();
  }
  local_30._M_head_impl = (ExceptionModuleField *)0x0;
  if (local_38 != (ExceptionModuleField *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExceptionType(Index index, TypeVector& sig) {
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  Exception& except = field->except;
  except.sig = sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}